

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void bitmanip::detail::registerTest(Test *test)

{
  int iVar1;
  __uniq_ptr_impl<bitmanip::Test,_std::default_delete<bitmanip::Test>_> local_10;
  
  if (registerTest(bitmanip::Test*)::tests == '\0') {
    iVar1 = __cxa_guard_acquire(&registerTest(bitmanip::Test*)::tests);
    if (iVar1 != 0) {
      registerTest::tests.
      super__Vector_base<std::unique_ptr<bitmanip::Test,_std::default_delete<bitmanip::Test>_>,_std::allocator<std::unique_ptr<bitmanip::Test,_std::default_delete<bitmanip::Test>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      registerTest::tests.
      super__Vector_base<std::unique_ptr<bitmanip::Test,_std::default_delete<bitmanip::Test>_>,_std::allocator<std::unique_ptr<bitmanip::Test,_std::default_delete<bitmanip::Test>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      registerTest::tests.
      super__Vector_base<std::unique_ptr<bitmanip::Test,_std::default_delete<bitmanip::Test>_>,_std::allocator<std::unique_ptr<bitmanip::Test,_std::default_delete<bitmanip::Test>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __cxa_atexit(std::
                   vector<std::unique_ptr<bitmanip::Test,_std::default_delete<bitmanip::Test>_>,_std::allocator<std::unique_ptr<bitmanip::Test,_std::default_delete<bitmanip::Test>_>_>_>
                   ::~vector,&registerTest::tests,&__dso_handle);
      __cxa_guard_release(&registerTest(bitmanip::Test*)::tests);
    }
  }
  if (registerTest(bitmanip::Test*)::reg_ == '\0') {
    iVar1 = __cxa_guard_acquire(&registerTest(bitmanip::Test*)::reg_);
    if (iVar1 != 0) {
      anyTestsRegistered = 1;
      registerTest::reg_ = 0;
      __cxa_guard_release(&registerTest(bitmanip::Test*)::reg_);
    }
  }
  local_10._M_t.super__Tuple_impl<0UL,_bitmanip::Test_*,_std::default_delete<bitmanip::Test>_>.
  super__Head_base<0UL,_bitmanip::Test_*,_false>._M_head_impl =
       (tuple<bitmanip::Test_*,_std::default_delete<bitmanip::Test>_>)
       (tuple<bitmanip::Test_*,_std::default_delete<bitmanip::Test>_>)test;
  std::
  vector<std::unique_ptr<bitmanip::Test,std::default_delete<bitmanip::Test>>,std::allocator<std::unique_ptr<bitmanip::Test,std::default_delete<bitmanip::Test>>>>
  ::emplace_back<std::unique_ptr<bitmanip::Test,std::default_delete<bitmanip::Test>>>
            ((vector<std::unique_ptr<bitmanip::Test,std::default_delete<bitmanip::Test>>,std::allocator<std::unique_ptr<bitmanip::Test,std::default_delete<bitmanip::Test>>>>
              *)&registerTest::tests,
             (unique_ptr<bitmanip::Test,_std::default_delete<bitmanip::Test>_> *)&local_10);
  if ((_Tuple_impl<0UL,_bitmanip::Test_*,_std::default_delete<bitmanip::Test>_>)
      local_10._M_t.super__Tuple_impl<0UL,_bitmanip::Test_*,_std::default_delete<bitmanip::Test>_>.
      super__Head_base<0UL,_bitmanip::Test_*,_false>._M_head_impl != (Test *)0x0) {
    (**(code **)(*(long *)local_10._M_t.
                          super__Tuple_impl<0UL,_bitmanip::Test_*,_std::default_delete<bitmanip::Test>_>
                          .super__Head_base<0UL,_bitmanip::Test_*,_false>._M_head_impl + 8))();
  }
  return;
}

Assistant:

void detail::registerTest(Test *test)
{
    static std::vector<std::unique_ptr<Test>> tests{};
    [[maybe_unused]] static const int reg_ = (testsPtr = &tests, anyTestsRegistered = true, 0);

    tests.push_back(std::unique_ptr<Test>{test});
}